

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tjunittest.c
# Opt level: O3

int checkBufYUV(uchar *buf,int w,int h,int subsamp,tjscalingfactor sf)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uchar *puVar9;
  int iVar10;
  char *pcVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  char *pcVar15;
  ulong uVar16;
  undefined8 uVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  int iVar23;
  ulong uVar24;
  ulong local_90;
  
  iVar3 = tjMCUWidth[(uint)subsamp];
  iVar20 = iVar3 + 7;
  if (-1 < iVar3) {
    iVar20 = iVar3;
  }
  iVar20 = iVar20 >> 3;
  iVar3 = tjMCUHeight[(uint)subsamp];
  iVar12 = iVar3 + 7;
  if (-1 < iVar3) {
    iVar12 = iVar3;
  }
  iVar12 = iVar12 >> 3;
  uVar18 = -iVar20 & (w + iVar20) - 1U;
  uVar8 = -iVar12 & (h + iVar12) - 1U;
  uVar6 = (long)(int)uVar18 / (long)iVar20 & 0xffffffff;
  uVar5 = (int)uVar8 / iVar12;
  iVar3 = (int)((long)(int)uVar18 / (long)iVar20);
  uVar13 = (pad + uVar18) - 1 & -pad;
  uVar7 = (pad + iVar3) - 1U & -pad;
  iVar4 = sf.num;
  iVar23 = sf.denom;
  iVar10 = (iVar4 * 8) / iVar23;
  if (0 < (int)uVar8) {
    lVar22 = (long)((iVar4 << 4) / iVar23);
    local_90 = 0;
    puVar9 = buf;
    do {
      if (0 < (int)uVar18) {
        uVar24 = 0;
        do {
          bVar1 = puVar9[uVar24];
          uVar21 = (ulong)bVar1;
          if (((int)((long)((ulong)(uint)((int)uVar24 >> 0x1f) << 0x20 | uVar24 & 0xffffffff) /
                    (long)iVar10) +
               (int)((long)((ulong)(uint)((int)local_90 >> 0x1f) << 0x20 | local_90 & 0xffffffff) /
                    (long)iVar10) & 1U) == 0) {
            if ((long)local_90 < lVar22) {
              if (bVar1 < 0xfe) {
                pcVar15 = "\nComp. %s at %d,%d should be 255, not %d\n";
LAB_00105729:
                pcVar11 = "y";
                local_90 = local_90 & 0xffffffff;
                uVar24 = uVar24 & 0xffffffff;
                uVar16 = uVar21;
                goto LAB_00105739;
              }
            }
            else if (1 < bVar1) {
              pcVar15 = "\nComp. %s at %d,%d should be 0, not %d\n";
              goto LAB_00105729;
            }
          }
          else if ((long)local_90 < lVar22) {
            if ((byte)(bVar1 + 0xb2) < 0xfd) {
              uVar17 = 0x4c;
LAB_0010571a:
              local_90 = local_90 & 0xffffffff;
              uVar24 = uVar24 & 0xffffffff;
              pcVar15 = "y";
              goto LAB_001057e5;
            }
          }
          else if ((byte)(bVar1 + 0x1c) < 0xfd) {
            uVar17 = 0xe2;
            goto LAB_0010571a;
          }
          uVar24 = uVar24 + 1;
        } while (uVar18 != uVar24);
      }
      local_90 = local_90 + 1;
      puVar9 = puVar9 + (int)uVar13;
    } while (local_90 != uVar8);
  }
  if ((subsamp != 3) && (0 < (int)uVar5)) {
    local_90 = 0;
    puVar9 = buf + (int)(uVar13 * uVar8);
    iVar14 = uVar13 * uVar8 + uVar7 * uVar5;
    do {
      if (0 < iVar3) {
        iVar19 = 0;
        uVar24 = 0;
LAB_0010562f:
        bVar1 = puVar9[uVar24];
        uVar16 = (ulong)bVar1;
        bVar2 = buf[iVar14 + (int)uVar24];
        uVar21 = (ulong)bVar2;
        if ((iVar19 / iVar10 + (iVar12 * (int)local_90) / iVar10 & 1U) == 0) {
          if ((byte)(bVar1 + 0x7e) < 0xfd) {
            uVar17 = 0x80;
LAB_001057ac:
            pcVar15 = "u";
            uVar21 = uVar16;
LAB_001057e5:
            printf("\nComp. %s at %d,%d should be %d, not %d\n",pcVar15,local_90,uVar24,uVar17,
                   uVar21);
LAB_001057ec:
            exitStatus = -1;
            if (0 < (int)uVar8) {
              uVar24 = 0;
              puVar9 = buf;
              do {
                if (0 < (int)uVar18) {
                  uVar21 = 0;
                  do {
                    printf("%.3d ",(ulong)puVar9[uVar21]);
                    uVar21 = uVar21 + 1;
                  } while (uVar18 != uVar21);
                }
                putchar(10);
                uVar24 = uVar24 + 1;
                puVar9 = puVar9 + (int)uVar13;
              } while (uVar24 != uVar8);
            }
            putchar(10);
            if ((int)uVar5 < 1) {
              putchar(10);
            }
            else {
              iVar20 = uVar13 * uVar8;
              uVar18 = 0;
              do {
                uVar24 = uVar6;
                iVar12 = iVar20;
                if (0 < iVar3) {
                  do {
                    printf("%.3d ",(ulong)buf[iVar12]);
                    uVar24 = uVar24 - 1;
                    iVar12 = iVar12 + 1;
                  } while (uVar24 != 0);
                }
                putchar(10);
                uVar18 = uVar18 + 1;
                iVar20 = iVar20 + uVar7;
              } while (uVar18 != uVar5);
              putchar(10);
              if (0 < (int)uVar5) {
                iVar20 = uVar7 * uVar5 + uVar13 * uVar8;
                uVar8 = 0;
                do {
                  uVar24 = uVar6;
                  iVar12 = iVar20;
                  if (0 < iVar3) {
                    do {
                      printf("%.3d ",(ulong)buf[iVar12]);
                      uVar24 = uVar24 - 1;
                      iVar12 = iVar12 + 1;
                    } while (uVar24 != 0);
                  }
                  putchar(10);
                  uVar8 = uVar8 + 1;
                  iVar20 = iVar20 + uVar7;
                } while (uVar8 != uVar5);
              }
            }
            return 0;
          }
          if ((byte)(bVar2 + 0x7e) < 0xfd) {
            pcVar15 = "v";
            uVar17 = 0x80;
            goto LAB_001057e5;
          }
        }
        else if ((long)local_90 < (long)(((int)(0x10 / (long)iVar12) * iVar4) / iVar23)) {
          if ((byte)(bVar1 + 0xa9) < 0xfd) {
            uVar17 = 0x55;
            goto LAB_001057ac;
          }
          if (bVar2 < 0xfe) {
            pcVar15 = "\nComp. %s at %d,%d should be 255, not %d\n";
            pcVar11 = "v";
            uVar16 = uVar21;
            goto LAB_00105739;
          }
        }
        else {
          if (1 < bVar1) {
            pcVar15 = "\nComp. %s at %d,%d should be 0, not %d\n";
            pcVar11 = "u";
LAB_00105739:
            printf(pcVar15,pcVar11,local_90,uVar24,uVar16);
            goto LAB_001057ec;
          }
          if ((byte)(bVar2 + 0x69) < 0xfd) {
            pcVar15 = "v";
            uVar17 = 0x95;
            goto LAB_001057e5;
          }
        }
        uVar24 = uVar24 + 1;
        iVar19 = iVar19 + iVar20;
        if (uVar6 == uVar24) goto LAB_001056ac;
        goto LAB_0010562f;
      }
LAB_001056ac:
      local_90 = local_90 + 1;
      puVar9 = puVar9 + (int)uVar7;
      iVar14 = iVar14 + uVar7;
    } while (local_90 != uVar5);
  }
  return 1;
}

Assistant:

static int checkBufYUV(unsigned char *buf, int w, int h, int subsamp,
                       tjscalingfactor sf)
{
  int row, col;
  int hsf = tjMCUWidth[subsamp] / 8, vsf = tjMCUHeight[subsamp] / 8;
  int pw = PAD(w, hsf), ph = PAD(h, vsf);
  int cw = pw / hsf, ch = ph / vsf;
  int ypitch = PAD(pw, pad), uvpitch = PAD(cw, pad);
  int retval = 1;
  int halfway = 16 * sf.num / sf.denom;
  int blocksize = 8 * sf.num / sf.denom;

  for (row = 0; row < ph; row++) {
    for (col = 0; col < pw; col++) {
      unsigned char y = buf[ypitch * row + col];

      if (((row / blocksize) + (col / blocksize)) % 2 == 0) {
        if (row < halfway) CHECKVAL255(y)
        else CHECKVAL0(y);
      } else {
        if (row < halfway) CHECKVAL(y, 76)
        else CHECKVAL(y, 226);
      }
    }
  }
  if (subsamp != TJSAMP_GRAY) {
    halfway = 16 / vsf * sf.num / sf.denom;

    for (row = 0; row < ch; row++) {
      for (col = 0; col < cw; col++) {
        unsigned char u = buf[ypitch * ph + (uvpitch * row + col)],
          v = buf[ypitch * ph + uvpitch * ch + (uvpitch * row + col)];

        if (((row * vsf / blocksize) + (col * hsf / blocksize)) % 2 == 0) {
          CHECKVAL(u, 128);  CHECKVAL(v, 128);
        } else {
          if (row < halfway) {
            CHECKVAL(u, 85);  CHECKVAL255(v);
          } else {
            CHECKVAL0(u);  CHECKVAL(v, 149);
          }
        }
      }
    }
  }

bailout:
  if (retval == 0) {
    for (row = 0; row < ph; row++) {
      for (col = 0; col < pw; col++)
        printf("%.3d ", buf[ypitch * row + col]);
      printf("\n");
    }
    printf("\n");
    for (row = 0; row < ch; row++) {
      for (col = 0; col < cw; col++)
        printf("%.3d ", buf[ypitch * ph + (uvpitch * row + col)]);
      printf("\n");
    }
    printf("\n");
    for (row = 0; row < ch; row++) {
      for (col = 0; col < cw; col++)
        printf("%.3d ",
               buf[ypitch * ph + uvpitch * ch + (uvpitch * row + col)]);
      printf("\n");
    }
  }

  return retval;
}